

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall SymbolTable::isActive(SymbolTable *this,string *name,string *curFun)

{
  pointer pvVar1;
  pointer pSVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  mapped_type *pmVar6;
  byte unaff_BPL;
  byte bVar7;
  SymbolTableElement *i;
  pointer pSVar8;
  SymbolTableElement *i_1;
  bool bVar9;
  bool bVar10;
  
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar8 = *(pointer *)
            &pvVar1[*pmVar6].
             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>._M_impl;
  pSVar2 = *(pointer *)
            ((long)&pvVar1[*pmVar6].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 8);
  bVar9 = pSVar8 == pSVar2;
  bVar7 = unaff_BPL;
  if (!bVar9) {
    sVar3 = name->_M_string_length;
    do {
      sVar4 = (pSVar8->name)._M_string_length;
      if (sVar4 == sVar3) {
        if (sVar4 == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp((pSVar8->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,sVar4);
          bVar10 = iVar5 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      bVar7 = pSVar8->isActive;
      if (bVar10) break;
      pSVar8 = pSVar8 + 1;
      bVar9 = pSVar8 == pSVar2;
      bVar7 = unaff_BPL;
    } while (!bVar9);
  }
  if (bVar9) {
    pSVar8 = (pvVar1->super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = *(pointer *)
              ((long)&(pvVar1->
                      super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                      _M_impl.super__Vector_impl_data + 8);
    if (pSVar8 != pSVar2) {
      sVar3 = name->_M_string_length;
      do {
        sVar4 = (pSVar8->name)._M_string_length;
        if (sVar4 == sVar3) {
          if (sVar4 == 0) {
            bVar9 = true;
          }
          else {
            iVar5 = bcmp((pSVar8->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,sVar4);
            bVar9 = iVar5 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        bVar7 = pSVar8->isActive;
        if (bVar9) goto LAB_00119ed9;
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar2);
    }
    bVar7 = 0;
  }
LAB_00119ed9:
  return (bool)(bVar7 & 1);
}

Assistant:

bool SymbolTable::isActive(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name) {
            return i.isActive;
        }
    }
    for (auto &i : symbolTable[0]) {
        if(i.name == name) {
            return i.isActive;
        }
    }

//    cout << "未找到该变量" << endl;
    return false;
}